

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall PlanTestPoolsWithDepthTwo::Run(PlanTestPoolsWithDepthTwo *this)

{
  Plan *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  __type condition;
  Node *pNVar4;
  reference ppEVar5;
  Edge *pEVar6;
  Edge *pEVar7;
  _Map_pointer pppEVar8;
  int iVar9;
  ulong __n;
  char *__s;
  _Elt_pointer ppEVar10;
  _Elt_pointer ppEVar11;
  string err;
  deque<Edge_*,_std::allocator<Edge_*>_> edges;
  string base_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar9 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_,
              "pool foobar\n  depth = 2\npool bazbin\n  depth = 2\nrule foocat\n  command = cat $in > $out\n  pool = foobar\nrule bazcat\n  command = cat $in > $out\n  pool = bazbin\nbuild out1: foocat in\nbuild out2: foocat in\nbuild out3: foocat in\nbuild outb1: bazcat in\nbuild outb2: bazcat in\nbuild outb3: bazcat in\n  pool =\nbuild allTheThings: cat out1 out2 out3 outb1 outb2 outb3\n"
              ,(ManifestParserOptions)0x0);
  if (iVar9 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  paVar1 = &err.field_2;
  for (iVar9 = -3; iVar9 != 0; iVar9 = iVar9 + 1) {
    err._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&err,'\x01');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edges,"out"
                   ,&err);
    pNVar4 = StateTestWithBuiltinRules::GetNode
                       ((StateTestWithBuiltinRules *)this,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edges)
    ;
    pNVar4->dirty_ = true;
    std::__cxx11::string::~string((string *)&edges);
    std::__cxx11::string::~string((string *)&err);
    err._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&err,'\x01');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edges,
                   "outb",&err);
    pNVar4 = StateTestWithBuiltinRules::GetNode
                       ((StateTestWithBuiltinRules *)this,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edges)
    ;
    pNVar4->dirty_ = true;
    std::__cxx11::string::~string((string *)&edges);
    std::__cxx11::string::~string((string *)&err);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&edges,"allTheThings",(allocator<char> *)&err);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,(string *)&edges);
  pNVar4->dirty_ = true;
  std::__cxx11::string::~string((string *)&edges);
  pTVar2 = g_current_test;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&edges,"allTheThings",(allocator<char> *)&base_name);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,(string *)&edges);
  this_00 = &(this->super_PlanTest).plan_;
  bVar3 = Plan::AddTarget(this_00,pNVar4,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
             ,0x11e,"plan_.AddTarget(GetNode(\"allTheThings\"), &err)");
  std::__cxx11::string::~string((string *)&edges);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0x11f,"\"\" == err");
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_0011f65d;
  }
  std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::_Deque_base
            (&edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>);
  PlanTest::FindWorkSorted(&this->super_PlanTest,&edges,5);
  for (__n = 0; __n != 4; __n = __n + 1) {
    ppEVar5 = std::_Deque_iterator<Edge_*,_Edge_*&,_Edge_**>::operator[]
                        (&edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                          super__Deque_impl_data._M_start,__n);
    pTVar2 = g_current_test;
    pEVar6 = *ppEVar5;
    bVar3 = std::operator==("in",&(*(pEVar6->inputs_).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_start)->env_path_);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x126,"\"in\" == edge->inputs_[0]->path()");
    if (!bVar3) goto LAB_0011f650;
    __s = "outb";
    if (__n < 2) {
      __s = "out";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&base_name,__s,(allocator<char> *)&local_50);
    pTVar2 = g_current_test;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
    std::operator+(&local_50,&base_name,&local_70);
    condition = std::operator==(&local_50,
                                &(*(pEVar6->outputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start)->env_path_);
    bVar3 = testing::Test::Check
                      (pTVar2,condition,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x128,"base_name + string(1, \'1\' + (i % 2)) == edge->outputs_[0]->path()")
    ;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar3) {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      std::__cxx11::string::~string((string *)&base_name);
      goto LAB_0011f653;
    }
    std::__cxx11::string::~string((string *)&base_name);
  }
  ppEVar5 = std::_Deque_iterator<Edge_*,_Edge_*&,_Edge_**>::operator[]
                      (&edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                        super__Deque_impl_data._M_start,4);
  pEVar6 = *ppEVar5;
  bVar3 = testing::Test::Check
                    (g_current_test,pEVar6 != (Edge *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0x12d,"edge");
  pTVar2 = g_current_test;
  if (bVar3) {
    bVar3 = std::operator==("in",&(*(pEVar6->inputs_).
                                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                    super__Vector_impl_data._M_start)->env_path_);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x12e,"\"in\" == edge->inputs_[0]->path()");
    pTVar2 = g_current_test;
    if (!bVar3) goto LAB_0011f4e6;
    bVar3 = std::operator==("outb3",&(*(pEVar6->outputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start)->env_path_);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x12f,"\"outb3\" == edge->outputs_[0]->path()");
    if (bVar3) {
      Plan::EdgeFinished(this_00,*edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                  super__Deque_impl_data._M_start._M_cur,kEdgeSucceeded,&err);
      pTVar2 = g_current_test;
      bVar3 = std::operator==("",&err);
      bVar3 = testing::Test::Check
                        (pTVar2,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0x133,"\"\" == err");
      if (!bVar3) goto LAB_0011f650;
      std::deque<Edge_*,_std::allocator<Edge_*>_>::pop_front(&edges);
      pEVar6 = Plan::FindWork(this_00);
      bVar3 = testing::Test::Check
                        (g_current_test,pEVar6 != (Edge *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0x138,"out3");
      pTVar2 = g_current_test;
      if (bVar3) {
        bVar3 = std::operator==("in",&(*(pEVar6->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start)->env_path_);
        bVar3 = testing::Test::Check
                          (pTVar2,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x139,"\"in\" == out3->inputs_[0]->path()");
        pTVar2 = g_current_test;
        if (!bVar3) goto LAB_0011f679;
        bVar3 = std::operator==("out3",&(*(pEVar6->outputs_).
                                          super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->env_path_);
        bVar3 = testing::Test::Check
                          (pTVar2,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x13a,"\"out3\" == out3->outputs_[0]->path()");
        pTVar2 = g_current_test;
        if (!bVar3) goto LAB_0011f679;
        pEVar7 = Plan::FindWork(this_00);
        bVar3 = testing::Test::Check
                          (pTVar2,pEVar7 == (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x13c,"plan_.FindWork()");
        if (!bVar3) goto LAB_0011f650;
        Plan::EdgeFinished(this_00,pEVar6,kEdgeSucceeded,&err);
        pTVar2 = g_current_test;
        bVar3 = std::operator==("",&err);
        bVar3 = testing::Test::Check
                          (pTVar2,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x13f,"\"\" == err");
        pTVar2 = g_current_test;
        if (!bVar3) goto LAB_0011f4e6;
        pEVar6 = Plan::FindWork(this_00);
        bVar3 = testing::Test::Check
                          (pTVar2,pEVar6 == (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x141,"plan_.FindWork()");
        if (!bVar3) goto LAB_0011f650;
        pppEVar8 = edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_node;
        ppEVar10 = edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last;
        ppEVar11 = edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
        while (ppEVar11 !=
               edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur) {
          Plan::EdgeFinished(this_00,*ppEVar11,kEdgeSucceeded,&err);
          pTVar2 = g_current_test;
          bVar3 = std::operator==("",&err);
          bVar3 = testing::Test::Check
                            (pTVar2,bVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0x145,"\"\" == err");
          if (!bVar3) goto LAB_0011f650;
          ppEVar11 = ppEVar11 + 1;
          if (ppEVar11 == ppEVar10) {
            ppEVar11 = pppEVar8[1];
            pppEVar8 = pppEVar8 + 1;
            ppEVar10 = ppEVar11 + 0x40;
          }
        }
        pEVar6 = Plan::FindWork(this_00);
        bVar3 = testing::Test::Check
                          (g_current_test,pEVar6 != (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x149,"last");
        pTVar2 = g_current_test;
        if (!bVar3) goto LAB_0011f679;
        bVar3 = std::operator==("allTheThings",
                                &(*(pEVar6->outputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start)->env_path_);
        bVar3 = testing::Test::Check
                          (pTVar2,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x14a,"\"allTheThings\" == last->outputs_[0]->path()");
        if (!bVar3) goto LAB_0011f650;
        Plan::EdgeFinished(this_00,pEVar6,kEdgeSucceeded,&err);
        pTVar2 = g_current_test;
        bVar3 = std::operator==("",&err);
        bVar3 = testing::Test::Check
                          (pTVar2,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x14d,"\"\" == err");
        if (bVar3) {
          bVar3 = testing::Test::Check
                            (g_current_test,
                             (this->super_PlanTest).plan_.command_edges_ < 1 ||
                             (this->super_PlanTest).plan_.wanted_edges_ < 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0x14f,"plan_.more_to_do()");
          pTVar2 = g_current_test;
          if (bVar3) {
            pEVar6 = Plan::FindWork(this_00);
            bVar3 = testing::Test::Check
                              (pTVar2,pEVar6 == (Edge *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0x150,"plan_.FindWork()");
            if (!bVar3) goto LAB_0011f650;
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
      else {
LAB_0011f679:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
LAB_0011f650:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
LAB_0011f4e6:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_0011f653:
  std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::~_Deque_base
            (&edges.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>);
LAB_0011f65d:
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

TEST_F(PlanTest, PoolsWithDepthTwo) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"pool foobar\n"
"  depth = 2\n"
"pool bazbin\n"
"  depth = 2\n"
"rule foocat\n"
"  command = cat $in > $out\n"
"  pool = foobar\n"
"rule bazcat\n"
"  command = cat $in > $out\n"
"  pool = bazbin\n"
"build out1: foocat in\n"
"build out2: foocat in\n"
"build out3: foocat in\n"
"build outb1: bazcat in\n"
"build outb2: bazcat in\n"
"build outb3: bazcat in\n"
"  pool =\n"
"build allTheThings: cat out1 out2 out3 outb1 outb2 outb3\n"
));
  // Mark all the out* nodes dirty
  for (int i = 0; i < 3; ++i) {
    GetNode("out" + string(1, '1' + static_cast<char>(i)))->MarkDirty();
    GetNode("outb" + string(1, '1' + static_cast<char>(i)))->MarkDirty();
  }
  GetNode("allTheThings")->MarkDirty();

  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("allTheThings"), &err));
  ASSERT_EQ("", err);

  deque<Edge*> edges;
  FindWorkSorted(&edges, 5);

  for (int i = 0; i < 4; ++i) {
    Edge *edge = edges[i];
    ASSERT_EQ("in",  edge->inputs_[0]->path());
    string base_name(i < 2 ? "out" : "outb");
    ASSERT_EQ(base_name + string(1, '1' + (i % 2)), edge->outputs_[0]->path());
  }

  // outb3 is exempt because it has an empty pool
  Edge* edge = edges[4];
  ASSERT_TRUE(edge);
  ASSERT_EQ("in",  edge->inputs_[0]->path());
  ASSERT_EQ("outb3", edge->outputs_[0]->path());

  // finish out1
  plan_.EdgeFinished(edges.front(), Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);
  edges.pop_front();

  // out3 should be available
  Edge* out3 = plan_.FindWork();
  ASSERT_TRUE(out3);
  ASSERT_EQ("in",  out3->inputs_[0]->path());
  ASSERT_EQ("out3", out3->outputs_[0]->path());

  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(out3, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.FindWork());

  for (deque<Edge*>::iterator it = edges.begin(); it != edges.end(); ++it) {
    plan_.EdgeFinished(*it, Plan::kEdgeSucceeded, &err);
    ASSERT_EQ("", err);
  }

  Edge* last = plan_.FindWork();
  ASSERT_TRUE(last);
  ASSERT_EQ("allTheThings", last->outputs_[0]->path());

  plan_.EdgeFinished(last, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.more_to_do());
  ASSERT_FALSE(plan_.FindWork());
}